

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

int gmath::anon_unknown_0::computeEquidistantDistortion(int n,double *x,int m,double *fvec,void *up)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = atan(*x);
  dVar2 = dVar1 * dVar1;
  dVar3 = dVar2 * dVar2;
  *fvec = *(double *)((long)up + 0x20) -
          (dVar3 * dVar3 * *(double *)((long)up + 0x18) +
          dVar2 * dVar3 * *(double *)((long)up + 0x10) +
          dVar3 * *(double *)((long)up + 8) + dVar2 * *up + 1.0) * dVar1;
  return 0;
}

Assistant:

int computeEquidistantDistortion(int n, double x[], int m, double fvec[], void *up)
{
  EquidistantDistortionParameter *p=static_cast<EquidistantDistortionParameter *>(up);

  const double theta=std::atan(x[0]);
  const double theta2=theta*theta;
  const double theta4=theta2*theta2;
  const double theta6=theta4*theta2;
  const double theta8=theta4*theta4;
  const double td=theta*(1+p->ed[0]*theta2+p->ed[1]*theta4+p->ed[2]*theta6+p->ed[3]*theta8);

  fvec[0]=p->radius-td;

  return 0;
}